

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.cpp
# Opt level: O1

bool lzham::prefix_coding::limit_max_code_size(uint num_syms,uint8 *pCodesizes,uint max_code_size)

{
  uint uVar1;
  uint uVar2;
  uint i;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  uint8 *__s;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint num_codes [35];
  uint next_sorted_ofs [35];
  uint8 new_codesizes [1024];
  uint auStack_558 [36];
  uint auStack_4c8 [36];
  uint8 local_438 [1032];
  
  if (0xffffffdd < max_code_size - 0x23 && 0xfffffbff < num_syms - 0x401) {
    memset(auStack_558,0,0x8c);
    if (num_syms == 0) {
      return true;
    }
    uVar8 = 0;
    bVar6 = false;
    do {
      bVar4 = pCodesizes[uVar8];
      auStack_558[bVar4] = auStack_558[bVar4] + 1;
      if (max_code_size < bVar4) {
        bVar6 = true;
      }
      uVar8 = uVar8 + 1;
    } while (num_syms != uVar8);
    if (!bVar6) {
      return true;
    }
    uVar7 = 0;
    lVar3 = 1;
    do {
      auStack_4c8[lVar3] = uVar7;
      uVar7 = uVar7 + auStack_558[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x23);
    if (uVar7 - 0x401 < 0xfffffc01) {
      return true;
    }
    uVar10 = 1 << ((byte)max_code_size & 0x1f);
    if (uVar7 <= uVar10) {
      uVar8 = (ulong)max_code_size;
      if (max_code_size < 0x22) {
        uVar7 = auStack_558[uVar8];
        lVar3 = uVar8 + 1;
        do {
          uVar7 = uVar7 + auStack_558[lVar3];
          auStack_558[uVar8] = uVar7;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x23);
      }
      if (max_code_size == 0) {
        uVar7 = 0;
      }
      else {
        bVar4 = 0;
        uVar7 = 0;
        uVar5 = uVar8;
        do {
          uVar9 = uVar5 - 1;
          uVar7 = uVar7 + (auStack_558[uVar5] << (bVar4 & 0x1f));
          bVar4 = bVar4 + 1;
          uVar5 = uVar9;
        } while ((int)uVar9 != 0);
      }
      if (uVar7 == uVar10) {
        return true;
      }
      do {
        auStack_558[uVar8] = auStack_558[uVar8] - 1;
        uVar2 = max_code_size - 1;
        do {
          uVar1 = uVar2;
          if (uVar1 == 0) goto LAB_00113887;
          uVar2 = uVar1 - 1;
        } while (auStack_558[uVar1] == 0);
        auStack_558[uVar1] = auStack_558[uVar1] - 1;
        auStack_558[uVar1 + 1] = auStack_558[uVar1 + 1] + 2;
        uVar7 = uVar7 - 1;
LAB_00113887:
        if (uVar1 == 0) {
          return false;
        }
        if (uVar7 == uVar10) {
          if (max_code_size != 0) {
            __s = local_438;
            uVar8 = 1;
            do {
              uVar5 = (ulong)auStack_558[uVar8];
              if (uVar5 != 0) {
                memset(__s,(int)uVar8,uVar5);
                __s = __s + uVar5;
              }
              uVar8 = uVar8 + 1;
            } while (max_code_size + 1 != uVar8);
          }
          uVar8 = 0;
          do {
            uVar5 = (ulong)pCodesizes[uVar8];
            if (uVar5 != 0) {
              uVar7 = auStack_4c8[uVar5];
              auStack_4c8[uVar5] = uVar7 + 1;
              pCodesizes[uVar8] = local_438[uVar7];
            }
            uVar8 = uVar8 + 1;
          } while (num_syms != uVar8);
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool limit_max_code_size(uint num_syms, uint8* pCodesizes, uint max_code_size)
      {
         const uint cMaxEverCodeSize = 34;            
         
         if ((!num_syms) || (num_syms > cMaxSupportedSyms) || (max_code_size < 1) || (max_code_size > cMaxEverCodeSize))
         {
            LZHAM_LOG_ERROR(3000);
            return false;
         }
         
         uint num_codes[cMaxEverCodeSize + 1];
         utils::zero_object(num_codes);

         bool should_limit = false;
         
         for (uint i = 0; i < num_syms; i++)
         {
            uint c = pCodesizes[i];
            
            LZHAM_ASSERT(c <= cMaxEverCodeSize);
            
            num_codes[c]++;
            if (c > max_code_size)
               should_limit = true;
         }
         
         if (!should_limit)
            return true;
         
         uint ofs = 0;
         uint next_sorted_ofs[cMaxEverCodeSize + 1];
         for (uint i = 1; i <= cMaxEverCodeSize; i++)
         {
            next_sorted_ofs[i] = ofs;
            ofs += num_codes[i];
         }
            
         if ((ofs < 2) || (ofs > cMaxSupportedSyms))
            return true;
         
         if (ofs > (1U << max_code_size))
         {
            LZHAM_LOG_ERROR(3001);
            return false;
         }
                           
         for (uint i = max_code_size + 1; i <= cMaxEverCodeSize; i++)
            num_codes[max_code_size] += num_codes[i];
         
         // Technique of adjusting tree to enforce maximum code size from LHArc. 
			// (If you remember what LHArc was, you've been doing this for a LONG time.)
         
         uint total = 0;
         for (uint i = max_code_size; i; --i)
            total += (num_codes[i] << (max_code_size - i));

         if (total == (1U << max_code_size))  
            return true;
            
         do
         {
            num_codes[max_code_size]--;

            uint i;
            for (i = max_code_size - 1; i; --i)
            {
               if (!num_codes[i])
                  continue;
               num_codes[i]--;          
               num_codes[i + 1] += 2;   
               break;
            }
            if (!i)
            {
               LZHAM_LOG_ERROR(3002);
               return false;
            }

            total--;   
         } while (total != (1U << max_code_size));
         
         uint8 new_codesizes[cMaxSupportedSyms];
         uint8* p = new_codesizes;
         for (uint i = 1; i <= max_code_size; i++)
         {
            uint n = num_codes[i];
            if (n)
            {
               memset(p, i, n);
               p += n;
            }
         }
                                             
         for (uint i = 0; i < num_syms; i++)
         {
            const uint c = pCodesizes[i];
            if (c)
            {
               uint next_ofs = next_sorted_ofs[c];
               next_sorted_ofs[c] = next_ofs + 1;
            
               pCodesizes[i] = static_cast<uint8>(new_codesizes[next_ofs]);
            }
         }
            
         return true;
      }